

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Scope * scope_D_Scope(D_Scope *current,D_Scope *scope)

{
  D_Scope *pDVar1;
  D_Scope *pDVar2;
  
  pDVar2 = (D_Scope *)calloc(1,0x50);
  pDVar1 = current->up;
  pDVar2->depth = current->depth;
  pDVar2->up = pDVar1;
  *(byte *)pDVar2 = *(byte *)current & 3;
  pDVar2->search = current;
  pDVar2->dynamic = scope;
  pDVar2->up_updates = current;
  pDVar2->down_next = current->down;
  current->down = pDVar2;
  return pDVar2;
}

Assistant:

D_Scope *scope_D_Scope(D_Scope *current, D_Scope *scope) {
  D_Scope *st = MALLOC(sizeof(D_Scope)), *parent = current->up;
  memset(st, 0, sizeof(D_Scope));
  st->depth = current->depth;
  st->up = parent;
  st->kind = current->kind;
  st->search = current;
  st->dynamic = scope;
  st->up_updates = current;
  st->down_next = current->down;
  current->down = st;
  return st;
}